

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

void Js::JavascriptRegExp::SetLastIndexProperty
               (Var instance,Var lastIndex,ScriptContext *scriptContext)

{
  RecyclableObject *object;
  
  object = VarTo<Js::RecyclableObject>(instance);
  JavascriptOperators::SetProperty
            (instance,object,0x1a2,lastIndex,scriptContext,
             PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible);
  return;
}

Assistant:

void JavascriptRegExp::SetLastIndexProperty(Var instance, Var lastIndex, ScriptContext* scriptContext)
    {
        JavascriptOperators::SetProperty(
            instance,
            VarTo<RecyclableObject>(instance),
            PropertyIds::lastIndex,
            lastIndex,
            scriptContext,
            static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNotExtensible | PropertyOperation_ThrowIfNonWritable));
    }